

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Half>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Half min,Half max,float gridSize)

{
  bool bVar1;
  Half HVar2;
  Half HVar3;
  deFloat16 dVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Half *other;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  undefined2 in_stack_00000012;
  Half x1;
  Half local_c2;
  Half y1;
  Half local_be;
  Half x2;
  Half y2;
  Half minQuadSize;
  int local_88;
  deRandom rnd;
  
  HVar3.m_value = max.m_value;
  iVar5 = componentCount * 2;
  if (stride != 0) {
    iVar5 = stride;
  }
  iVar7 = 0;
  if (primitive == PRIMITIVE_TRIANGLES) {
    iVar7 = iVar5 * 6;
  }
  pcVar6 = (char *)operator_new__((long)(iVar7 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar15 = GLValue::Half::halfToFloat(HVar3.m_value);
    fVar16 = GLValue::Half::halfToFloat(min.m_value);
    fVar15 = fVar15 - fVar16;
    uVar14 = -(uint)(-fVar15 <= fVar15);
    minQuadSize.m_value =
         GLValue::Half::floatToHalf
                   ((float)(~uVar14 & (uint)-fVar15 | (uint)fVar15 & uVar14) * gridSize);
    other = &minQuadSize;
    x1 = minValue<deqp::gls::GLValue::Half>();
    bVar1 = GLValue::Half::operator>(&x1,other);
    local_be = minQuadSize;
    if (bVar1) {
      local_be = minValue<deqp::gls::GLValue::Half>();
    }
    uVar9 = 0;
    uVar12 = (ulong)(uint)count;
    if (count < 1) {
      uVar12 = uVar9;
    }
    iVar11 = 4;
    iVar10 = 6;
    HVar3.m_value = 1;
    while( true ) {
      if (uVar9 == uVar12) break;
      iVar13 = 4;
      do {
        do {
          bVar1 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          if (bVar1) goto LAB_00856123;
          local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,min,(deFloat16)_max);
          x1 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
          HVar3.m_value = local_be.m_value;
          HVar2 = GLValue::Half::operator-(&max,&x1);
          HVar2 = abs<deqp::gls::GLValue::Half>(HVar2);
          local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,HVar3,HVar2);
          x2 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
          local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,min,(deFloat16)_max);
          y1 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
          HVar3.m_value = local_be.m_value;
          HVar2 = GLValue::Half::operator-(&max,&y1);
          HVar2 = abs<deqp::gls::GLValue::Half>(HVar2);
          local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,HVar3,HVar2);
          y2 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
          if (componentCount < 3) {
            HVar3.m_value = GLValue::Half::floatToHalf(0.0);
LAB_0085605e:
            dVar4 = GLValue::Half::floatToHalf(1.0);
            other = (Half *)(ulong)dVar4;
            if (componentCount < 3) goto LAB_00856123;
          }
          else {
            local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,min,(deFloat16)_max);
            HVar3 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
            if (componentCount == 3) goto LAB_0085605e;
            local_c2 = getRandom<deqp::gls::GLValue::Half>(&rnd,min,(deFloat16)_max);
            HVar2 = roundTo<deqp::gls::GLValue::Half>(&local_be,&local_c2);
            other = (Half *)(ulong)HVar2.m_value;
          }
          fVar15 = GLValue::Half::halfToFloat(x2.m_value);
          fVar16 = GLValue::Half::halfToFloat(HVar3.m_value);
          fVar16 = fVar16 + fVar15;
          uVar14 = -(uint)(-fVar16 <= fVar16);
          fVar15 = GLValue::Half::halfToFloat(local_be.m_value);
        } while ((float)(~uVar14 & (uint)-fVar16 | (uint)fVar16 & uVar14) < fVar15);
        fVar15 = GLValue::Half::halfToFloat(y2.m_value);
        fVar16 = GLValue::Half::halfToFloat((deFloat16)other);
        fVar16 = fVar16 + fVar15;
        uVar14 = -(uint)(-fVar16 <= fVar16);
        fVar15 = GLValue::Half::halfToFloat(local_be.m_value);
      } while ((float)(~uVar14 & (uint)-fVar16 | (uint)fVar16 & uVar14) < fVar15);
LAB_00856123:
      local_88 = (int)uVar9;
      local_88 = iVar7 * local_88;
      *(deFloat16 *)(pcVar6 + (long)local_88 + (long)offset) = x1.m_value;
      *(deFloat16 *)(pcVar6 + (long)(local_88 + 2) + (long)offset) = y1.m_value;
      HVar2 = GLValue::Half::operator+(&x1,&x2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5) + (long)offset) = HVar2.m_value;
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 + 2) + (long)offset) = y1.m_value;
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 2) + (long)offset) = x1.m_value;
      HVar2 = GLValue::Half::operator+(&y1,&y2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + 2 + iVar5 * 2) + (long)offset) = HVar2.m_value;
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 3) + (long)offset) = x1.m_value;
      HVar2 = GLValue::Half::operator+(&y1,&y2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + 2 + iVar5 * 3) + (long)offset) = HVar2.m_value;
      HVar2 = GLValue::Half::operator+(&x1,&x2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 4) + (long)offset) = HVar2.m_value;
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 4 + 2) + (long)offset) = y1.m_value;
      HVar2 = GLValue::Half::operator+(&x1,&x2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 5) + (long)offset) = HVar2.m_value;
      HVar2 = GLValue::Half::operator+(&y1,&y2);
      *(deFloat16 *)(pcVar6 + (long)(local_88 + iVar5 * 5 + 2) + (long)offset) = HVar2.m_value;
      if (2 < componentCount) {
        lVar8 = 6;
        iVar13 = iVar11;
        while (bVar1 = lVar8 != 0, lVar8 = lVar8 + -1, bVar1) {
          *(deFloat16 *)(pcVar6 + (long)iVar13 + (long)offset) = HVar3.m_value;
          iVar13 = iVar13 + iVar5;
        }
        if (componentCount != 3) {
          lVar8 = 6;
          iVar13 = iVar10;
          while (bVar1 = lVar8 != 0, lVar8 = lVar8 + -1, bVar1) {
            *(short *)(pcVar6 + (long)iVar13 + (long)offset) = (short)other;
            iVar13 = iVar13 + iVar5;
          }
        }
      }
      uVar9 = uVar9 + 1;
      iVar11 = iVar11 + iVar7;
      iVar10 = iVar10 + iVar7;
    }
  }
  return pcVar6;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}